

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestMemCheckCommand::Clone(cmCTestMemCheckCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(200);
  cmCTestTestCommand::cmCTestTestCommand((cmCTestTestCommand *)this_00);
  (((cmCTestHandlerCommand *)&this_00->super_cmObject)->super_cmCTestCommand).super_cmCommand.
  super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCTestHandlerCommand_006ce4d0;
  pcVar1 = (cmMakefile *)
           (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           CTestScriptHandler;
  this_00[1].super_cmObject._vptr_cmObject =
       (_func_int **)
       (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  this_00[1].Makefile = pcVar1;
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestMemCheckCommand* ni = new cmCTestMemCheckCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
    }